

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.h
# Opt level: O0

bool __thiscall CKey::operator>(CKey *this,CKey *RHSKey)

{
  bool local_21;
  bool local_11;
  CKey *RHSKey_local;
  CKey *this_local;
  
  local_11 = true;
  if (this->key[0] <= RHSKey->key[0]) {
    local_21 = false;
    if (this->key[0] == RHSKey->key[0]) {
      local_21 = RHSKey->key[1] < this->key[1];
    }
    local_11 = local_21;
  }
  return local_11;
}

Assistant:

bool operator >(CKey& RHSKey)
    {
        //iterate through the keys
        //the 0ht is the most important key
#if KEY_SIZE == 1
        return (key[0] > RHSKey.key[0]);
#elif KEY_SIZE == 2
        return (key[0] > RHSKey.key[0] || (key[0] == RHSKey.key[0] && key[1] > RHSKey.key[1]));
#else
        for(int i = 0; i < KEY_SIZE; i++)
        {
            //compare the current key
            if(key[i] > RHSKey.key[i])
            return true;
            else if(key[i] < RHSKey.key[i])
            return false;
        }
        //all are equal
        return false;
#endif
    }